

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCancellationTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_47e9a::BuildEngineCancellationTest_basic_Test::TestBody
          (BuildEngineCancellationTest_basic_Test *this)

{
  initializer_list<llbuild::core::KeyType> __l;
  bool bVar1;
  SimpleRule *pSVar2;
  ValueType *pVVar3;
  char *pcVar4;
  reference pvVar5;
  KeyType *local_2e0;
  AssertHelper local_2d8;
  Message local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_6;
  Message local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_5;
  Message local_290;
  size_type local_288;
  uint local_27c;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_4;
  Message local_260;
  KeyType local_258;
  int32_t local_238;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_3;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  Message local_1f8;
  size_type local_1f0;
  uint local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_1;
  Message local_1c8;
  size_type local_1c0;
  uint local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_180 [8];
  ValueType result;
  ComputeFnType local_160;
  allocator<llbuild::core::KeyType> local_139;
  KeyType local_138;
  iterator local_118;
  size_type local_110;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_108;
  KeyType local_f0;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_d0;
  anon_class_24_3_98fb59f8 local_c8;
  ComputeFnType local_b0;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_90;
  KeyType local_78;
  unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_58;
  bool local_49;
  bool cancelIt;
  BuildEngine engine;
  SimpleBuildEngineDelegate delegate;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  builtKeys;
  BuildEngineCancellationTest_basic_Test *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&delegate.expectError);
  SimpleBuildEngineDelegate::SimpleBuildEngineDelegate((SimpleBuildEngineDelegate *)&engine);
  llbuild::core::BuildEngine::BuildEngine
            ((BuildEngine *)&stack0xffffffffffffffb8,(BuildEngineDelegate *)&engine);
  local_49 = false;
  pSVar2 = (SimpleRule *)operator_new(0x68);
  llbuild::core::KeyType::KeyType(&local_78,"value-A");
  memset(&local_90,0,0x18);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector(&local_90);
  local_c8.builtKeys =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&delegate.expectError;
  local_c8.cancelIt = &local_49;
  local_c8.engine = (BuildEngine *)&stack0xffffffffffffffb8;
  std::function<int(std::vector<int,std::allocator<int>>const&)>::
  function<(anonymous_namespace)::BuildEngineCancellationTest_basic_Test::TestBody()::__0,void>
            ((function<int(std::vector<int,std::allocator<int>>const&)> *)&local_b0,&local_c8);
  SimpleRule::SimpleRule(pSVar2,&local_78,&local_90,&local_b0);
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)&local_58,
             (pointer)pSVar2);
  llbuild::core::BuildEngine::addRule((BuildEngine *)&stack0xffffffffffffffb8,&local_58);
  std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
            (&local_58);
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_b0);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_90);
  llbuild::core::KeyType::~KeyType(&local_78);
  pSVar2 = (SimpleRule *)operator_new(0x68);
  llbuild::core::KeyType::KeyType(&local_f0,"result");
  llbuild::core::KeyType::KeyType(&local_138,"value-A");
  local_118 = &local_138;
  local_110 = 1;
  std::allocator<llbuild::core::KeyType>::allocator(&local_139);
  __l._M_len = local_110;
  __l._M_array = local_118;
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::vector
            (&local_108,__l,&local_139);
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &delegate.expectError;
  std::function<int(std::vector<int,std::allocator<int>>const&)>::
  function<(anonymous_namespace)::BuildEngineCancellationTest_basic_Test::TestBody()::__1,void>
            ((function<int(std::vector<int,std::allocator<int>>const&)> *)&local_160,
             (anon_class_8_1_c2f48032 *)
             &result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  SimpleRule::SimpleRule(pSVar2,&local_f0,&local_108,&local_160);
  std::unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>>::
  unique_ptr<std::default_delete<llbuild::core::Rule>,void>
            ((unique_ptr<llbuild::core::Rule,std::default_delete<llbuild::core::Rule>> *)&local_d0,
             (pointer)pSVar2);
  llbuild::core::BuildEngine::addRule((BuildEngine *)&stack0xffffffffffffffb8,&local_d0);
  std::unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_>::~unique_ptr
            (&local_d0);
  std::function<int_(const_std::vector<int,_std::allocator<int>_>_&)>::~function(&local_160);
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_108);
  std::allocator<llbuild::core::KeyType>::~allocator(&local_139);
  local_2e0 = (KeyType *)&local_118;
  do {
    local_2e0 = local_2e0 + -1;
    llbuild::core::KeyType::~KeyType(local_2e0);
  } while (local_2e0 != &local_138);
  llbuild::core::KeyType::~KeyType(&local_f0);
  local_49 = true;
  llbuild::core::KeyType::KeyType((KeyType *)&gtest_ar.message_,"result");
  pVVar3 = llbuild::core::BuildEngine::build
                     ((BuildEngine *)&stack0xffffffffffffffb8,(KeyType *)&gtest_ar.message_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,pVVar3);
  llbuild::core::KeyType::~KeyType((KeyType *)&gtest_ar.message_);
  local_1b4 = 0;
  local_1c0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1b0,"0U","result.size()",&local_1b4,&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineCancellationTest.cpp"
               ,0xac,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1e4 = 1;
  local_1f0 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&delegate.expectError);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1e0,"1U","builtKeys.size()",&local_1e4,&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineCancellationTest.cpp"
               ,0xad,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&delegate.expectError,0);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_210,"\"value-A\"","builtKeys[0]",(char (*) [8])"value-A",pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineCancellationTest.cpp"
               ,0xae,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  llbuild::core::BuildEngine::resetForBuild((BuildEngine *)&stack0xffffffffffffffb8);
  local_49 = false;
  local_234 = 6;
  llbuild::core::KeyType::KeyType(&local_258,"result");
  pVVar3 = llbuild::core::BuildEngine::build((BuildEngine *)&stack0xffffffffffffffb8,&local_258);
  local_238 = intFromValue(pVVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_230,"2 * 3","intFromValue(engine.build(\"result\"))",&local_234,
             &local_238);
  llbuild::core::KeyType::~KeyType(&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineCancellationTest.cpp"
               ,0xb3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  local_27c = 2;
  local_288 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&delegate.expectError);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_278,"2U","builtKeys.size()",&local_27c,&local_288);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineCancellationTest.cpp"
               ,0xb4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&delegate.expectError,0);
  testing::internal::EqHelper::
  Compare<char[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2a8,"\"value-A\"","builtKeys[0]",(char (*) [8])"value-A",pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineCancellationTest.cpp"
               ,0xb5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&delegate.expectError,1);
  testing::internal::EqHelper::
  Compare<char[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_2c8,"\"result\"","builtKeys[1]",(char (*) [7])0x2f5cf6,pvVar5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineCancellationTest.cpp"
               ,0xb6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper(&local_2d8);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  llbuild::core::BuildEngine::~BuildEngine((BuildEngine *)&stack0xffffffffffffffb8);
  SimpleBuildEngineDelegate::~SimpleBuildEngineDelegate((SimpleBuildEngineDelegate *)&engine);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&delegate.expectError);
  return;
}

Assistant:

TEST(BuildEngineCancellationTest, basic) {
  std::vector<std::string> builtKeys;
  SimpleBuildEngineDelegate delegate;
  core::BuildEngine engine(delegate);
  bool cancelIt = false;
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "value-A", {}, [&] (const std::vector<int>& inputs) {
          builtKeys.push_back("value-A");
          fprintf(stderr, "building A (and cancelling ? %d)\n", cancelIt);
          if (cancelIt) {
            engine.cancelBuild();
          }
          return 2; })));
  engine.addRule(std::unique_ptr<core::Rule>(new SimpleRule(
      "result", {"value-A"},
                   [&] (const std::vector<int>& inputs) {
                     EXPECT_EQ(1U, inputs.size());
                     EXPECT_EQ(2, inputs[0]);
                     builtKeys.push_back("result");
                     return inputs[0] * 3;
                   })));

  // Build the result, cancelling during the first task.
  cancelIt = true;
  auto result = engine.build("result");
  EXPECT_EQ(0U, result.size());
  EXPECT_EQ(1U, builtKeys.size());
  EXPECT_EQ("value-A", builtKeys[0]);

  // Build again, without cancelling; both tasks should run.
  engine.resetForBuild();
  cancelIt = false;
  EXPECT_EQ(2 * 3, intFromValue(engine.build("result")));
  EXPECT_EQ(2U, builtKeys.size());
  EXPECT_EQ("value-A", builtKeys[0]);
  EXPECT_EQ("result", builtKeys[1]);
}